

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce.hpp
# Opt level: O0

void __thiscall
diy::detail::ReductionFunctor<PointBlock<3U>,_diy::RegularMergePartners>::operator()
          (ReductionFunctor<PointBlock<3U>,_diy::RegularMergePartners> *this,PointBlock<3U> *b,
          ProxyWithLink *cp)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  OutgoingQueues *this_00;
  size_type sVar5;
  Link *this_01;
  Proxy *in_RDX;
  RegularMergePartners *in_RDI;
  BlockID target;
  const_iterator __end4;
  const_iterator __begin4;
  Neighbors *__range4;
  OutgoingQueues *outgoing;
  ReduceProxy rp;
  vector<int,_std::allocator<int>_> outgoing_gids;
  vector<int,_std::allocator<int>_> incoming_gids;
  Master *in_stack_fffffffffffffe28;
  RegularMergePartners *__args_2;
  ReduceProxy *in_stack_fffffffffffffe30;
  PointBlock<3U> *in_stack_fffffffffffffe38;
  function<void_(PointBlock<3U>_*,_const_diy::ReduceProxy_&,_const_diy::RegularMergePartners_&)>
  *in_stack_fffffffffffffe40;
  Master *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe74;
  Master *in_stack_fffffffffffffe78;
  pointer *this_02;
  undefined4 uVar6;
  undefined8 in_stack_fffffffffffffe98;
  uint round;
  void *in_stack_fffffffffffffea0;
  __normal_iterator<const_diy::BlockID_*,_std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>_>
  in_stack_fffffffffffffea8;
  ReduceProxy *in_stack_fffffffffffffeb0;
  GIDVector *in_stack_fffffffffffffec0;
  undefined1 local_48 [72];
  
  round = (uint)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  this_02 = &(in_RDI->super_RegularPartners).kvs_.
             super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  uVar6 = *(undefined4 *)
           &(in_RDI->super_RegularPartners).divisions_.super__Vector_base<int,_std::allocator<int>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_48._48_8_ = in_RDX;
  iVar3 = Master::Proxy::gid(in_RDX);
  Master::Proxy::master((Proxy *)local_48._48_8_);
  bVar2 = RegularMergePartners::active
                    ((RegularMergePartners *)this_02,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                     in_stack_fffffffffffffe78);
  if (bVar2) {
    Catch::clara::std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)0x1fa4f7);
    Catch::clara::std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)0x1fa504);
    if (0 < *(int *)&(in_RDI->super_RegularPartners).divisions_.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start) {
      in_stack_fffffffffffffe68 =
           (Master *)
           &(in_RDI->super_RegularPartners).kvs_.
            super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
      in_stack_fffffffffffffe70 =
           *(undefined4 *)
            &(in_RDI->super_RegularPartners).divisions_.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
      in_stack_fffffffffffffe74 = Master::Proxy::gid((Proxy *)local_48._48_8_);
      in_stack_fffffffffffffe78 = Master::Proxy::master((Proxy *)local_48._48_8_);
      RegularMergePartners::incoming
                ((RegularMergePartners *)in_stack_fffffffffffffe40,
                 (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),(int)in_stack_fffffffffffffe38,
                 (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe30,
                 in_stack_fffffffffffffe28);
    }
    iVar1 = *(int *)&(in_RDI->super_RegularPartners).divisions_.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start;
    sVar4 = RegularPartners::rounds((RegularPartners *)0x1fa59a);
    if (iVar1 < (int)sVar4) {
      Master::Proxy::gid((Proxy *)local_48._48_8_);
      Master::Proxy::master((Proxy *)local_48._48_8_);
      RegularMergePartners::outgoing
                (in_RDI,(int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                 (int)in_stack_fffffffffffffe78,
                 (vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                 in_stack_fffffffffffffe68);
    }
    __args_2 = (RegularMergePartners *)local_48;
    ReduceProxy::ReduceProxy
              (in_stack_fffffffffffffeb0,(Proxy *)in_stack_fffffffffffffea8._M_current,
               in_stack_fffffffffffffea0,round,(Assigner *)CONCAT44(iVar3,uVar6),
               (GIDVector *)this_02,in_stack_fffffffffffffec0);
    Catch::clara::std::
    function<void_(PointBlock<3U>_*,_const_diy::ReduceProxy_&,_const_diy::RegularMergePartners_&)>::
    operator()(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
               __args_2);
    this_00 = Master::Proxy::outgoing((Proxy *)&stack0xfffffffffffffec0);
    sVar5 = Catch::clara::std::
            map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
            ::size((map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
                    *)0x1fa699);
    ReduceProxy::out_link((ReduceProxy *)&stack0xfffffffffffffec0);
    iVar3 = Link::size((Link *)0x1fa6b3);
    if (sVar5 < (ulong)(long)iVar3) {
      this_01 = ReduceProxy::out_link((ReduceProxy *)&stack0xfffffffffffffec0);
      in_stack_fffffffffffffe30 = (ReduceProxy *)Link::neighbors(this_01);
      Catch::clara::std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>::begin
                ((vector<diy::BlockID,_std::allocator<diy::BlockID>_> *)__args_2);
      Catch::clara::std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>::end
                ((vector<diy::BlockID,_std::allocator<diy::BlockID>_> *)__args_2);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_diy::BlockID_*,_std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>_>
                                 *)in_stack_fffffffffffffe30,
                                (__normal_iterator<const_diy::BlockID_*,_std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>_>
                                 *)__args_2), bVar2) {
        __gnu_cxx::
        __normal_iterator<const_diy::BlockID_*,_std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>_>
        ::operator*((__normal_iterator<const_diy::BlockID_*,_std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>_>
                     *)&stack0xfffffffffffffea8);
        Catch::clara::std::
        map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
        ::operator[]((map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
                      *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                     (key_type *)in_stack_fffffffffffffe68);
        __gnu_cxx::
        __normal_iterator<const_diy::BlockID_*,_std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>_>
        ::operator++((__normal_iterator<const_diy::BlockID_*,_std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>_>
                      *)&stack0xfffffffffffffea8);
      }
    }
    ReduceProxy::~ReduceProxy(in_stack_fffffffffffffe30);
    Catch::clara::std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)this_00);
    Catch::clara::std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)this_00);
  }
  return;
}

Assistant:

void        operator()(Block* b, const Master::ProxyWithLink& cp) const
    {
      if (!partners.active(round, cp.gid(), *cp.master())) return;

      std::vector<int> incoming_gids, outgoing_gids;
      if (round > 0)
          partners.incoming(round, cp.gid(), incoming_gids, *cp.master());        // receive from the previous round
      if (round < static_cast<int>(partners.rounds()))
          partners.outgoing(round, cp.gid(), outgoing_gids, *cp.master());        // send to the next round

      ReduceProxy   rp(std::move(const_cast<Master::ProxyWithLink&>(cp)), b, round, assigner, incoming_gids, outgoing_gids);
      reduce(b, rp, partners);

      // touch the outgoing queues to make sure they exist
      Master::Proxy::OutgoingQueues& outgoing = *rp.outgoing();
      if (outgoing.size() < static_cast<size_t>(rp.out_link().size()))
        for (BlockID target : rp.out_link().neighbors())
          outgoing[target];       // touch the outgoing queue, creating it if necessary
    }